

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<void_*>::setCapacity(Vector<void_*> *this,size_t newSize)

{
  void **ppvVar1;
  void **ppvVar2;
  RemoveConst<void_*> *ppvVar3;
  ulong __n;
  ArrayBuilder<void_*> local_38;
  
  ppvVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppvVar1 >> 3)) {
    (this->builder).pos = ppvVar1 + newSize;
  }
  local_38.pos = (RemoveConst<void_*> *)
                 _::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  ppvVar1 = (this->builder).ptr;
  ppvVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (ppvVar1 != ppvVar2) {
    __n = (long)ppvVar2 - (long)ppvVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,ppvVar1,__n);
    local_38.pos = (RemoveConst<void_*> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<void_*>::operator=(&this->builder,&local_38);
  ppvVar2 = local_38.endPtr;
  ppvVar3 = local_38.pos;
  ppvVar1 = local_38.ptr;
  if (local_38.ptr != (void **)0x0) {
    local_38.ptr = (void **)0x0;
    local_38.pos = (RemoveConst<void_*> *)0x0;
    local_38.endPtr = (void **)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,ppvVar1,8,(long)ppvVar3 - (long)ppvVar1 >> 3,
               (long)ppvVar2 - (long)ppvVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }